

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O2

void __thiscall synth_state::run<short>(synth_state *this,short *audiobuffer,long nframes)

{
  float fVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  
  if (nframes < 1) {
    nframes = 0;
  }
  uVar3 = (ulong)(uint)this->num_channels;
  lVar2 = 0;
  while (lVar4 = lVar2, lVar4 < (int)uVar3) {
    fVar1 = this->sample_rate;
    for (lVar5 = 0; lVar2 = lVar4 + 1, nframes != lVar5; lVar5 = lVar5 + 1) {
      fVar6 = sinf(this->phase[lVar4]);
      uVar3 = (ulong)this->num_channels;
      audiobuffer[lVar4 + uVar3 * lVar5] = (short)(int)(fVar6 * 0.2 * 32767.0);
      this->phase[lVar4] =
           this->phase[lVar4] + ((float)(int)(lVar4 + 1) * 220.0 * 6.2831855) / fVar1;
    }
  }
  return;
}

Assistant:

void run(T* audiobuffer, long nframes)
    {
      for(int c=0;c < num_channels;++c) {
        float freq = get_frequency(c);
        float phase_inc = 2.0 * M_PI * freq / sample_rate;
        for(long n=0;n < nframes;++n) {
          audiobuffer[n*num_channels+c] = ConvertSample<T>(sin(phase[c]) * VOLUME);
          phase[c] += phase_inc;
        }
      }
    }